

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O0

void OpenSteer::
     mapPointToPathAlike<OpenSteer::PolylineSegmentedPathwaySegmentRadii,(anonymous_namespace)::PointToSegmentIndexMapping>
               (PolylineSegmentedPathwaySegmentRadii *pathAlike,Vec3 *point,
               PointToSegmentIndexMapping *mapping)

{
  PointToSegmentIndexMapping *in_stack_000000d0;
  Vec3 *in_stack_000000d8;
  PolylineSegmentedPathwaySegmentRadii *in_stack_000000e0;
  
  PointToPathAlikeMapping<OpenSteer::PolylineSegmentedPathwaySegmentRadii,_(anonymous_namespace)::PointToSegmentIndexMapping,_OpenSteer::PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySegmentRadii>_>
  ::map(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  return;
}

Assistant:

void mapPointToPathAlike( PathAlike const& pathAlike, Vec3 const& point, Mapping& mapping ) {
        PointToPathAlikeMapping< PathAlike, Mapping >::map( pathAlike, point, mapping );
    }